

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O0

void __thiscall OpenMD::IcosahedralOfR::writeOrderParameter(IcosahedralOfR *this)

{
  int iVar1;
  byte bVar2;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  string *psVar6;
  ostream *poVar7;
  ulong uVar8;
  reference pvVar9;
  StaticAnalyser *in_RDI;
  RealType Rval_1;
  uint i_1;
  ofstream osw;
  RealType Rval;
  uint i;
  ofstream osq;
  Revision rev;
  Revision *in_stack_fffffffffffff9a8;
  char *in_stack_fffffffffffff9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  Revision *in_stack_fffffffffffff9f8;
  string local_540 [32];
  double local_520;
  uint local_514;
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  ostream local_4b0 [512];
  string local_2b0 [32];
  double local_290;
  uint local_284;
  string local_280 [32];
  string local_260 [48];
  string local_230 [32];
  ostream local_210 [528];
  
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar3,_S_out);
  std::__cxx11::string::~string(local_230);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    uVar4 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"IcosahedralOfR: unable to open %s\n",uVar4);
    std::__cxx11::string::~string(local_2b0);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_210,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_210,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffff9f8);
    poVar5 = std::operator<<(poVar5,local_260);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_260);
    poVar5 = std::operator<<(local_210,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff9a8);
    poVar5 = std::operator<<(poVar5,local_280);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_280);
    poVar5 = std::operator<<(local_210,"# selection script: \"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[1].info_);
    std::operator<<(poVar5,"\"\n");
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      poVar5 = std::operator<<(local_210,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->paramString_);
      std::operator<<(poVar5,"\n");
    }
    for (local_284 = 0; local_284 < in_RDI->nBins_; local_284 = local_284 + 1) {
      local_290 = ((double)local_284 + 0.5) * (double)in_RDI[9].dumpFilename_._M_string_length;
      std::ostream::operator<<(local_210,local_290);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[9].outputTypes_,
                          (ulong)local_284);
      if (*pvVar9 == 0) {
        poVar5 = std::operator<<(local_210,"\t");
        std::ostream::operator<<(poVar5,0);
        std::operator<<(local_210,"\n");
      }
      else {
        poVar5 = std::operator<<(local_210,"\t");
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[10].dumpFilename_._M_string_length,(ulong)local_284);
        iVar1 = *pvVar9;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_RDI[9].outputTypes_,
                            (ulong)local_284);
        std::ostream::operator<<(poVar5,(double)iVar1 / (double)*pvVar9);
        std::operator<<(local_210,"\n");
      }
    }
    std::ofstream::close();
  }
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_4b0,pcVar3,_S_out);
  std::__cxx11::string::~string(local_4d0);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    uVar4 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"IcosahedralOfR: unable to open %s\n",uVar4);
    std::__cxx11::string::~string(local_540);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_4b0,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar7 = std::operator<<(local_4b0,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)poVar5);
    poVar5 = std::operator<<(poVar7,local_4f0);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_4f0);
    poVar5 = std::operator<<(local_4b0,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff9a8);
    poVar5 = std::operator<<(poVar5,local_510);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_510);
    poVar5 = std::operator<<(local_4b0,"# selection script: \"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[1].info_);
    std::operator<<(poVar5,"\"\n");
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      poVar5 = std::operator<<(local_4b0,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->paramString_);
      std::operator<<(poVar5,"\n");
    }
    for (local_514 = 0; local_514 < in_RDI->nBins_; local_514 = local_514 + 1) {
      local_520 = (double)in_RDI[9].dumpFilename_._M_string_length * ((double)local_514 + 0.5);
      std::ostream::operator<<(local_4b0,local_520);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[9].outputTypes_,
                          (ulong)local_514);
      if (*pvVar9 == 0) {
        poVar5 = std::operator<<(local_4b0,"\t");
        std::ostream::operator<<(poVar5,0);
        std::operator<<(local_4b0,"\n");
      }
      else {
        poVar5 = std::operator<<(local_4b0,"\t");
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 10),(ulong)local_514);
        iVar1 = *pvVar9;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_RDI[9].outputTypes_,
                            (ulong)local_514);
        std::ostream::operator<<(poVar5,(double)iVar1 / (double)*pvVar9);
        std::operator<<(local_4b0,"\n");
      }
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_4b0);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void IcosahedralOfR::writeOrderParameter() {
    Revision rev;
    std::ofstream osq((getOutputFileName() + "qr").c_str());

    if (osq.is_open()) {
      osq << "# " << getAnalysisType() << "\n";
      osq << "# OpenMD " << rev.getFullRevision() << "\n";
      osq << "# " << rev.getBuildDate() << "\n";
      osq << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osq << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:

      for (unsigned int i = 0; i < nBins_; ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        osq << Rval;
        if (RCount_[i] == 0) {
          osq << "\t" << 0;
          osq << "\n";
        } else {
          osq << "\t" << (RealType)QofR_[i] / (RealType)RCount_[i];
          osq << "\n";
        }
      }

      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "IcosahedralOfR: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }

    std::ofstream osw((getOutputFileName() + "wr").c_str());

    if (osw.is_open()) {
      osw << "# " << getAnalysisType() << "\n";
      osw << "# OpenMD " << rev.getFullRevision() << "\n";
      osw << "# " << rev.getBuildDate() << "\n";
      osw << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osw << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:
      for (unsigned int i = 0; i < nBins_; ++i) {
        RealType Rval = deltaR_ * (i + 0.5);
        osw << Rval;
        if (RCount_[i] == 0) {
          osw << "\t" << 0;
          osw << "\n";
        } else {
          osw << "\t" << (RealType)WofR_[i] / (RealType)RCount_[i];
          osw << "\n";
        }
      }

      osw.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "IcosahedralOfR: unable to open %s\n",
               (getOutputFileName() + "w").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }